

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

PClassActor * FState::StaticFindStateOwner(FState *state,PClassActor *info)

{
  PClassActor *local_20;
  PClassActor *info_local;
  FState *state_local;
  
  local_20 = info;
  while( true ) {
    if (local_20 == (PClassActor *)0x0) {
      return (PClassActor *)0x0;
    }
    if ((local_20->OwnedStates <= state) &&
       (state < local_20->OwnedStates + local_20->NumOwnedStates)) break;
    local_20 = dyn_cast<PClassActor>((DObject *)(local_20->super_PClass).ParentClass);
  }
  return local_20;
}

Assistant:

PClassActor *FState::StaticFindStateOwner (const FState *state, PClassActor *info)
{
	while (info != NULL)
	{
		if (state >= info->OwnedStates &&
			state <  info->OwnedStates + info->NumOwnedStates)
		{
			return info;
		}
		info = dyn_cast<PClassActor>(info->ParentClass);
	}
	return NULL;
}